

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void google::protobuf::internal::MapMergeFrom<bool,proto2_unittest::Proto2MapEnumPlusExtra>
               (Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *dest,
               Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra> *src)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  NodeBase *pNVar4;
  pair<google::protobuf::Map<bool,_proto2_unittest::Proto2MapEnumPlusExtra>::iterator,_bool>
  local_50;
  
  uVar2 = (src->super_KeyMapBase<bool>).super_UntypedMapBase.index_of_first_non_null_;
  uVar3 = (ulong)uVar2;
  if (uVar2 == (src->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_) {
    uVar3 = 0;
    pNVar4 = (NodeBase *)0x0;
  }
  else {
    pNVar4 = (src->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar3];
    if (pNVar4 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar4 != (NodeBase *)0x0) {
    do {
      uVar1 = *(undefined4 *)((long)&pNVar4[1].next + 4);
      Map<bool,proto2_unittest::Proto2MapEnumPlusExtra>::TryEmplaceInternal<bool_const&>
                (&local_50,dest,(bool *)(pNVar4 + 1));
      *(undefined4 *)((long)&local_50.first.super_UntypedMapIterator.node_[1].next + 4) = uVar1;
      pNVar4 = pNVar4->next;
      if (pNVar4 == (NodeBase *)0x0) {
        do {
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
          if ((src->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_ <= uVar2) {
            pNVar4 = (NodeBase *)0x0;
            uVar3 = 0;
            break;
          }
          pNVar4 = (src->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar2];
        } while (pNVar4 == (NodeBase *)0x0);
      }
    } while (pNVar4 != (NodeBase *)0x0);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}